

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O2

void __thiscall Fir1::setCoeff(Fir1 *this,double *coeff_data,uint number_of_taps)

{
  double *pdVar1;
  runtime_error *this_00;
  ulong uVar2;
  
  if (this->taps == number_of_taps) {
    pdVar1 = this->coefficients;
    for (uVar2 = 0; number_of_taps != uVar2; uVar2 = uVar2 + 1) {
      pdVar1[uVar2] = coeff_data[uVar2];
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid number of taps in new coefficient array");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Fir1::setCoeff(const double* coeff_data, const unsigned number_of_taps) {

	if (number_of_taps != taps) {
		throw std::runtime_error("Invalid number of taps in new coefficient array");
	}
	for (unsigned int i = 0; i < number_of_taps; i++) {
		coefficients[i] = coeff_data[i];
	}
}